

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

bool __thiscall helics::CommsInterface::reconnect(CommsInterface *this)

{
  ConnectionStatus CVar1;
  long *in_RDI;
  CommsInterface *in_stack_00000010;
  string_view in_stack_00000018;
  int cnt;
  ConnectionStatus in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  int local_3c;
  duration<long,std::ratio<1l,1000l>> local_38 [24];
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  duration<long,std::ratio<1l,1000l>> local_18 [12];
  int local_c;
  
  std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
            ((atomic<helics::CommsInterface::ConnectionStatus> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
            );
  std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
            ((atomic<helics::CommsInterface::ConnectionStatus> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
            );
  (**(code **)(*in_RDI + 0x48))();
  (**(code **)(*in_RDI + 0x40))();
  local_c = 0;
  do {
    CVar1 = std::atomic<helics::CommsInterface::ConnectionStatus>::load
                      ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 1),seq_cst);
    if (CVar1 != RECONNECTING) goto LAB_0046271c;
    in_stack_ffffffffffffffe4 = 0x32;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              (local_18,(int *)&stack0xffffffffffffffe4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    local_c = local_c + 1;
  } while (local_c != 400);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,(char *)in_RDI);
  logError(in_stack_00000010,in_stack_00000018);
LAB_0046271c:
  local_c = 0;
  do {
    CVar1 = std::atomic<helics::CommsInterface::ConnectionStatus>::load
                      ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 0x32),seq_cst);
    if (CVar1 != RECONNECTING) goto LAB_0046279e;
    local_3c = 0x32;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_38,&local_3c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    local_c = local_c + 1;
  } while (local_c != 400);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,(char *)in_RDI);
  logError(in_stack_00000010,in_stack_00000018);
LAB_0046279e:
  CVar1 = std::atomic<helics::CommsInterface::ConnectionStatus>::load
                    ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 1),seq_cst);
  bVar2 = false;
  if (CVar1 == CONNECTED) {
    CVar1 = std::atomic<helics::CommsInterface::ConnectionStatus>::load
                      ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 0x32),seq_cst);
    bVar2 = CVar1 == CONNECTED;
  }
  return bVar2;
}

Assistant:

bool CommsInterface::reconnect()
{
    rxStatus = ConnectionStatus::RECONNECTING;
    txStatus = ConnectionStatus::RECONNECTING;
    reconnectReceiver();
    reconnectTransmitter();
    int cnt = 0;
    while (rxStatus.load() == ConnectionStatus::RECONNECTING) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        ++cnt;
        if (cnt == 400)  // Eventually give up
        {
            logError("unable to reconnect");
            break;
        }
    }
    cnt = 0;
    while (txStatus.load() == ConnectionStatus::RECONNECTING) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        ++cnt;
        if (cnt == 400) {
            logError("unable to reconnect");
            break;
        }
    }

    return ((rxStatus.load() == ConnectionStatus::CONNECTED) &&
            (txStatus.load() == ConnectionStatus::CONNECTED));
}